

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O1

boolean revive_nasty(int x,int y,char *msg)

{
  obj *poVar1;
  int iVar2;
  int iVar3;
  boolean bVar4;
  boolean bVar5;
  uint uVar6;
  obj *corpse;
  monst *mtmp;
  monst *pmVar7;
  coord cc;
  coord local_42;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  corpse = level->objects[x][y];
  local_40 = x;
  local_3c = y;
  if (corpse == (obj *)0x0) {
    bVar4 = '\0';
  }
  else {
    bVar4 = '\0';
    local_34 = (int)(char)x;
    local_38 = (int)(char)y;
    do {
      poVar1 = (corpse->v).v_nexthere;
      if (((corpse->otyp == 0x10e) && (uVar6 = corpse->corpsenm - 0x128, uVar6 < 0x1f)) &&
         ((0x70000001U >> (uVar6 & 0x1f) & 1) != 0)) {
        pmVar7 = level->monsters[x][y];
        if ((pmVar7 == (monst *)0x0) || ((pmVar7->field_0x61 & 2) != 0)) {
          pmVar7 = (monst *)0x0;
        }
        if ((pmVar7 != (monst *)0x0) &&
           (bVar4 = enexto(&local_42,level,(xchar)local_34,(xchar)local_38,pmVar7->data),
           bVar4 != '\0')) {
          rloc_to(pmVar7,level,(int)local_42.x,(int)local_42.y);
        }
        if (msg != (char *)0x0) {
          Norep("%s",msg);
        }
        bVar4 = revive_corpse(corpse);
      }
      corpse = poVar1;
    } while (poVar1 != (obj *)0x0);
  }
  iVar3 = local_3c;
  iVar2 = local_40;
  if (bVar4 != '\0') {
    pmVar7 = level->monsters[x][y];
    mtmp = (monst *)0x0;
    if ((pmVar7 != (monst *)0x0) && ((pmVar7->field_0x61 & 2) == 0)) {
      mtmp = pmVar7;
    }
    if (((mtmp != (monst *)0x0) && (bVar5 = goodpos(level,local_40,local_3c,mtmp,0), bVar5 == '\0'))
       && (bVar5 = enexto(&local_42,level,(xchar)iVar2,(xchar)iVar3,mtmp->data), bVar5 != '\0')) {
      rloc_to(mtmp,level,(int)local_42.x,(int)local_42.y);
    }
  }
  return bVar4;
}

Assistant:

boolean revive_nasty(int x, int y, const char *msg)
{
    struct obj *otmp, *otmp2;
    struct monst *mtmp;
    coord cc;
    boolean revived = FALSE;

    for (otmp = level->objects[x][y]; otmp; otmp = otmp2) {
	otmp2 = otmp->nexthere;
	if (otmp->otyp == CORPSE &&
	    (is_rider(&mons[otmp->corpsenm]) ||
	     otmp->corpsenm == PM_WIZARD_OF_YENDOR)) {
	    /* move any living monster already at that location */
	    if ((mtmp = m_at(level, x,y)) && enexto(&cc, level, x, y, mtmp->data))
		rloc_to(mtmp, level, cc.x, cc.y);
	    if (msg) Norep("%s", msg);
	    revived = revive_corpse(otmp);
	}
    }

    /* this location might not be safe, if not, move revived monster */
    if (revived) {
	mtmp = m_at(level, x,y);
	if (mtmp && !goodpos(level, x, y, mtmp, 0) &&
	    enexto(&cc, level, x, y, mtmp->data)) {
	    rloc_to(mtmp, level, cc.x, cc.y);
	}
	/* else impossible? */
    }

    return revived;
}